

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::add_blocked_sample
          (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this,double t)

{
  Sample s;
  Sample local_40;
  
  local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = 0;
  local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_40.blocked = true;
  local_40.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample>>
              *)this,&local_40);
  this->_dirty = true;
  if (local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_40.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }